

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::editingFinished(QComboBoxPrivate *this)

{
  QComboBox *this_00;
  QComboBox *this_01;
  byte bVar1;
  MatchFlags flags;
  int index;
  QCompleter *pQVar2;
  QItemSelectionModel *pQVar3;
  qsizetype qVar4;
  QAbstractItemView *this_02;
  long in_FS_OFFSET;
  bool bVar5;
  QStringView QVar6;
  QStringView QVar7;
  QList<QModelIndex> local_a8;
  QString local_90;
  QString local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lineEdit == (QLineEdit *)0x0) goto LAB_003dedba;
  this_00 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_78,this->lineEdit);
  qVar4 = local_78.d.size;
  if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) {
    bVar1 = 0;
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_58,&this->currentIndex);
    itemText(&local_90,this,(QModelIndex *)&local_58);
    bVar1 = 1;
    if (local_90.d.size == local_78.d.size) {
      QVar6.m_data = local_90.d.ptr;
      QVar6.m_size = local_90.d.size;
      QVar7.m_data = local_78.d.ptr;
      QVar7.m_size = local_78.d.size;
      bVar1 = QtPrivate::equalStrings(QVar6,QVar7);
      bVar1 = bVar1 ^ 1;
    }
  }
  if (((undefined1 *)qVar4 != (undefined1 *)0x0) &&
     (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar1 != 0) {
    pQVar2 = QLineEdit::completer(this->lineEdit);
    if (pQVar2 == (QCompleter *)0x0) {
      this_02 = (QAbstractItemView *)0x0;
    }
    else {
      this_02 = *(QAbstractItemView **)(*(long *)&pQVar2->field_0x8 + 0x90);
    }
    if ((this_02 != (QAbstractItemView *)0x0) &&
       ((*(byte *)(*(long *)(this_02 + 0x20) + 9) & 0x80) != 0)) {
      pQVar3 = QAbstractItemView::selectionModel(this_02);
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::currentIndex((QModelIndex *)&local_58,this_02);
      if (pQVar3 == (QItemSelectionModel *)0x0) {
        bVar5 = false;
      }
      else {
        QItemSelectionModel::selectedIndexes();
        qVar4 = QtPrivate::indexOf<QModelIndex,QModelIndex>(&local_a8,(QModelIndex *)&local_58,0);
        bVar5 = qVar4 != -1;
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,0x18,0x10);
          }
        }
      }
      if (bVar5) goto LAB_003ded97;
    }
    this_01 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
    flags = matchFlags(this);
    ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_78);
    index = QComboBox::findData(this_01,(QVariant *)&local_58,0,flags);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (index != -1) {
      QComboBox::setCurrentIndex(this_00,index);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_58,&this->currentIndex);
      emitActivated(this,(QModelIndex *)&local_58);
    }
  }
LAB_003ded97:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_003dedba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::editingFinished()
{
    Q_Q(QComboBox);
    if (!lineEdit)
        return;
    const auto leText = lineEdit->text();
    if (!leText.isEmpty() && itemText(currentIndex) != leText) {
#if QT_CONFIG(completer)
        const auto *leCompleter = lineEdit->completer();
        const auto *popup = leCompleter ? QCompleterPrivate::get(leCompleter)->popup : nullptr;
        if (popup && popup->isVisible()) {
            // QLineEdit::editingFinished() will be emitted before the code flow returns
            // to QCompleter::eventFilter(), where QCompleter::activated() may be emitted.
            // We know that the completer popup will still be visible at this point, and
            // that any selection should be valid.
            const QItemSelectionModel *selModel = popup->selectionModel();
            const QModelIndex curIndex = popup->currentIndex();
            const bool completerIsActive = selModel && selModel->selectedIndexes().contains(curIndex);

            if (completerIsActive)
                return;
        }
#endif
        const int index = q_func()->findText(leText, matchFlags());
        if (index != -1) {
            q->setCurrentIndex(index);
            emitActivated(currentIndex);
        }
    }

}